

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::getResults(Network *this,Value *reply,Document *doc,int version)

{
  int in_ECX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  uint64_t i;
  const_iterator __end1;
  const_iterator __begin1;
  array<unsigned_long,_10UL> *__range1;
  Value best;
  Value results;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined8 in_stack_fffffffffffffe98;
  Type type;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffea0;
  NetworkState *in_stack_fffffffffffffea8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericStringRef<char> *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_01;
  GenericStringRef<char> *this_01;
  StringRefType *in_stack_fffffffffffffef8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8;
  GenericStringRef<char> local_e8;
  GenericStringRef<char> local_d8;
  value_type_conflict4 local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_b0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_a8;
  GenericStringRef<char> local_98;
  GenericStringRef<char> local_88;
  undefined1 local_78 [48];
  GenericStringRef<char> local_48;
  MemoryPoolAllocator<rapidjson::CrtAllocator> local_38;
  
  local_38.baseAllocator_._4_4_ = in_ECX;
  local_38.userBuffer_ =
       rapidjson::
       GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       ::GetAllocator(in_RDX);
  allocator_01 = &local_38;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  this_01 = &local_48;
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(this_01,(char (*) [13])"diff_current");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(unsigned_long)this_01,allocator_01
            );
  this_00 = (GenericStringRef<char> *)(local_78 + 0x10);
  rapidjson::GenericStringRef<char>::GenericStringRef<12u>(this_00,(char (*) [12])"shares_good");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(unsigned_long)this_01,allocator_01
            );
  allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_78;
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>
            ((GenericStringRef<char> *)allocator_00,(char (*) [13])"shares_total");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(unsigned_long)this_01,allocator_01
            );
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_88,(char (*) [9])"avg_time");
  NetworkState::avgTime(in_stack_fffffffffffffea8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(uint)((ulong)this_01 >> 0x20),
             allocator_01);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>(&local_98,(char (*) [13])"hashes_total");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(unsigned_long)this_01,allocator_01
            );
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffea0,(Type)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  local_b0 = in_RDI + 0x14;
  local_b8 = std::array<unsigned_long,_10UL>::begin((array<unsigned_long,_10UL> *)0x236bdb);
  local_c0 = std::array<unsigned_long,_10UL>::end((array<unsigned_long,_10UL> *)0x236bf0);
  for (; type = (Type)((ulong)in_stack_fffffffffffffe98 >> 0x20), local_b8 != local_c0;
      local_b8 = local_b8 + 1) {
    local_c8 = *local_b8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<unsigned_long>(in_RDI,(unsigned_long)this_00,allocator_00);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_d8,(char (*) [5])"best");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this_01,allocator_01);
  if (local_38.baseAllocator_._4_4_ == 1) {
    rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_e8,(char (*) [10])"error_log");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue(in_stack_fffffffffffffea0,type);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this_01,allocator_01);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_f8);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>
            ((GenericStringRef<char> *)&stack0xfffffffffffffef8,(char (*) [8])"results");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this_01,allocator_01);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_a8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&local_38);
  return;
}

Assistant:

void xmrig::Network::getResults(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value results(kObjectType);

    results.AddMember("diff_current",  m_state.diff, allocator);
    results.AddMember("shares_good",   m_state.accepted, allocator);
    results.AddMember("shares_total",  m_state.accepted + m_state.rejected, allocator);
    results.AddMember("avg_time",      m_state.avgTime(), allocator);
    results.AddMember("hashes_total",  m_state.total, allocator);

    Value best(kArrayType);
    for (uint64_t i : m_state.topDiff) {
        best.PushBack(i, allocator);
    }

    results.AddMember("best", best, allocator);

    if (version == 1) {
        results.AddMember("error_log", Value(kArrayType), allocator);
    }

    reply.AddMember("results", results, allocator);
}